

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymacro.c
# Opt level: O1

wchar_t keymacro_delete(EditLine *el,wchar_t *key)

{
  wchar_t *in_RDX;
  wchar_t wVar1;
  
  if (*key == L'\0') {
    fwrite("keymacro_delete: Null extended-key not allowed.\n",0x30,1,(FILE *)el->el_errfile);
    wVar1 = L'\xffffffff';
  }
  else {
    wVar1 = L'\0';
    if ((el->el_keymacro).map != (keymacro_node_t *)0x0) {
      node__delete((EditLine *)&(el->el_keymacro).map,(keymacro_node_t **)key,in_RDX);
      wVar1 = L'\0';
    }
  }
  return wVar1;
}

Assistant:

libedit_private int
keymacro_delete(EditLine *el, const wchar_t *key)
{

	if (key[0] == '\0') {
		(void) fprintf(el->el_errfile,
		    "keymacro_delete: Null extended-key not allowed.\n");
		return -1;
	}
	if (el->el_keymacro.map == NULL)
		return 0;

	(void) node__delete(el, &el->el_keymacro.map, key);
	return 0;
}